

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O2

void __thiscall vkt::sr::ShaderRenderCaseInstance::setup(ShaderRenderCaseInstance *this)

{
  pointer pVVar1;
  pointer pVVar2;
  pointer pVVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  DescriptorSetLayoutBuilder *this_00;
  DescriptorPoolBuilder *this_01;
  DescriptorSetUpdateBuilder *this_02;
  ulong in_stack_ffffffffffffffd0;
  
  tcu::TextureLevel::TextureLevel((TextureLevel *)&stack0xffffffffffffffc8);
  tcu::TextureLevel::operator=(&this->m_resultImage,(TextureLevel *)&stack0xffffffffffffffc8);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&stack0xffffffffffffffc8);
  this_00 = (DescriptorSetLayoutBuilder *)operator_new(0x48);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(this_00);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = in_stack_ffffffffffffffd0;
  de::details::
  UniqueBase<vk::DescriptorSetLayoutBuilder,_de::DefaultDeleter<vk::DescriptorSetLayoutBuilder>_>::
  assignData(&(this->m_descriptorSetLayoutBuilder).
              super_UniqueBase<vk::DescriptorSetLayoutBuilder,_de::DefaultDeleter<vk::DescriptorSetLayoutBuilder>_>
             ,(PtrData<vk::DescriptorSetLayoutBuilder,_de::DefaultDeleter<vk::DescriptorSetLayoutBuilder>_>
               )(auVar4 << 0x40));
  de::details::
  UniqueBase<vk::DescriptorSetLayoutBuilder,_de::DefaultDeleter<vk::DescriptorSetLayoutBuilder>_>::
  ~UniqueBase((UniqueBase<vk::DescriptorSetLayoutBuilder,_de::DefaultDeleter<vk::DescriptorSetLayoutBuilder>_>
               *)&stack0xffffffffffffffc8);
  this_01 = (DescriptorPoolBuilder *)operator_new(0x18);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder(this_01);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = in_stack_ffffffffffffffd0;
  de::details::UniqueBase<vk::DescriptorPoolBuilder,_de::DefaultDeleter<vk::DescriptorPoolBuilder>_>
  ::assignData(&(this->m_descriptorPoolBuilder).
                super_UniqueBase<vk::DescriptorPoolBuilder,_de::DefaultDeleter<vk::DescriptorPoolBuilder>_>
               ,(PtrData<vk::DescriptorPoolBuilder,_de::DefaultDeleter<vk::DescriptorPoolBuilder>_>)
                (auVar5 << 0x40));
  de::details::UniqueBase<vk::DescriptorPoolBuilder,_de::DefaultDeleter<vk::DescriptorPoolBuilder>_>
  ::~UniqueBase((UniqueBase<vk::DescriptorPoolBuilder,_de::DefaultDeleter<vk::DescriptorPoolBuilder>_>
                 *)&stack0xffffffffffffffc8);
  this_02 = (DescriptorSetUpdateBuilder *)operator_new(0x48);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(this_02);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = in_stack_ffffffffffffffd0;
  de::details::
  UniqueBase<vk::DescriptorSetUpdateBuilder,_de::DefaultDeleter<vk::DescriptorSetUpdateBuilder>_>::
  assignData(&(this->m_descriptorSetUpdateBuilder).
              super_UniqueBase<vk::DescriptorSetUpdateBuilder,_de::DefaultDeleter<vk::DescriptorSetUpdateBuilder>_>
             ,(PtrData<vk::DescriptorSetUpdateBuilder,_de::DefaultDeleter<vk::DescriptorSetUpdateBuilder>_>
               )(auVar6 << 0x40));
  de::details::
  UniqueBase<vk::DescriptorSetUpdateBuilder,_de::DefaultDeleter<vk::DescriptorSetUpdateBuilder>_>::
  ~UniqueBase((UniqueBase<vk::DescriptorSetUpdateBuilder,_de::DefaultDeleter<vk::DescriptorSetUpdateBuilder>_>
               *)&stack0xffffffffffffffc8);
  std::
  vector<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>,_std::allocator<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>_>_>
  ::clear(&this->m_uniformInfos);
  pVVar1 = (this->m_vertexBindingDescription).
           super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_vertexBindingDescription).
      super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
      ._M_impl.super__Vector_impl_data._M_finish != pVVar1) {
    (this->m_vertexBindingDescription).
    super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
    ._M_impl.super__Vector_impl_data._M_finish = pVVar1;
  }
  pVVar2 = (this->m_vertexAttributeDescription).
           super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_vertexAttributeDescription).
      super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
      ._M_impl.super__Vector_impl_data._M_finish != pVVar2) {
    (this->m_vertexAttributeDescription).
    super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
    ._M_impl.super__Vector_impl_data._M_finish = pVVar2;
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ::clear(&this->m_vertexBuffers);
  std::vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>::clear
            (&this->m_vertexBufferAllocs);
  pVVar3 = (this->m_pushConstantRanges).
           super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_pushConstantRanges).
      super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar3) {
    (this->m_pushConstantRanges).
    super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar3;
  }
  return;
}

Assistant:

void ShaderRenderCaseInstance::setup (void)
{
	m_resultImage					= tcu::TextureLevel();
	m_descriptorSetLayoutBuilder	= de::MovePtr<DescriptorSetLayoutBuilder>	(new DescriptorSetLayoutBuilder());
	m_descriptorPoolBuilder			= de::MovePtr<DescriptorPoolBuilder>		(new DescriptorPoolBuilder());
	m_descriptorSetUpdateBuilder	= de::MovePtr<DescriptorSetUpdateBuilder>	(new DescriptorSetUpdateBuilder());

	m_uniformInfos.clear();
	m_vertexBindingDescription.clear();
	m_vertexAttributeDescription.clear();
	m_vertexBuffers.clear();
	m_vertexBufferAllocs.clear();
	m_pushConstantRanges.clear();
}